

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void __thiscall
leveldb::Version::GetOverlappingInputs
          (Version *this,int level,InternalKey *begin,InternalKey *end,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs)

{
  pointer ppFVar1;
  Comparator *pCVar2;
  int iVar3;
  size_t i;
  ulong uVar4;
  long in_FS_OFFSET;
  Slice file_limit;
  Slice file_start;
  FileMetaData *f;
  Slice local_80;
  Slice local_70;
  FileMetaData *local_60;
  Slice local_58;
  Slice local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (level < 0) {
    __assert_fail("level >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,0x1f6,
                  "void leveldb::Version::GetOverlappingInputs(int, const InternalKey *, const InternalKey *, std::vector<FileMetaData *> *)"
                 );
  }
  if (6 < (uint)level) {
    __assert_fail("level < config::kNumLevels",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,0x1f7,
                  "void leveldb::Version::GetOverlappingInputs(int, const InternalKey *, const InternalKey *, std::vector<FileMetaData *> *)"
                 );
  }
  ppFVar1 = (inputs->
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((inputs->super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar1) {
    (inputs->super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = ppFVar1;
  }
  local_48 = (Slice)ZEXT816(0x722d76);
  local_58 = (Slice)ZEXT816(0x722d76);
  if (begin != (InternalKey *)0x0) {
    local_48 = InternalKey::user_key(begin);
  }
  if (end != (InternalKey *)0x0) {
    local_58 = InternalKey::user_key(end);
  }
  pCVar2 = (this->vset_->icmp_).user_comparator_;
  do {
    uVar4 = 0;
LAB_0053c016:
    do {
      ppFVar1 = this->files_[(uint)level].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)this->files_[(uint)level].
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3) <= uVar4) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return;
        }
        __stack_chk_fail();
      }
      local_60 = ppFVar1[uVar4];
      uVar4 = uVar4 + 1;
      local_70 = InternalKey::user_key(&local_60->smallest);
      local_80 = InternalKey::user_key(&local_60->largest);
      if (begin != (InternalKey *)0x0) {
        iVar3 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&local_80,&local_48);
        if (iVar3 < 0) goto LAB_0053c016;
      }
      if (end != (InternalKey *)0x0) {
        iVar3 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&local_70,&local_58);
        if (0 < iVar3) goto LAB_0053c016;
      }
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
                (inputs,&local_60);
      if (level != 0) goto LAB_0053c016;
      if (begin != (InternalKey *)0x0) {
        iVar3 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&local_70,&local_48);
        if (iVar3 < 0) {
          local_48 = local_70;
          goto LAB_0053c113;
        }
      }
      if (end == (InternalKey *)0x0) goto LAB_0053c016;
      iVar3 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&local_80,&local_58);
    } while (iVar3 < 1);
    local_58 = local_80;
LAB_0053c113:
    ppFVar1 = (inputs->
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    if ((inputs->
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
        _M_impl.super__Vector_impl_data._M_finish != ppFVar1) {
      (inputs->super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      )._M_impl.super__Vector_impl_data._M_finish = ppFVar1;
    }
  } while( true );
}

Assistant:

void Version::GetOverlappingInputs(int level, const InternalKey* begin,
                                   const InternalKey* end,
                                   std::vector<FileMetaData*>* inputs) {
  assert(level >= 0);
  assert(level < config::kNumLevels);
  inputs->clear();
  Slice user_begin, user_end;
  if (begin != nullptr) {
    user_begin = begin->user_key();
  }
  if (end != nullptr) {
    user_end = end->user_key();
  }
  const Comparator* user_cmp = vset_->icmp_.user_comparator();
  for (size_t i = 0; i < files_[level].size();) {
    FileMetaData* f = files_[level][i++];
    const Slice file_start = f->smallest.user_key();
    const Slice file_limit = f->largest.user_key();
    if (begin != nullptr && user_cmp->Compare(file_limit, user_begin) < 0) {
      // "f" is completely before specified range; skip it
    } else if (end != nullptr && user_cmp->Compare(file_start, user_end) > 0) {
      // "f" is completely after specified range; skip it
    } else {
      inputs->push_back(f);
      if (level == 0) {
        // Level-0 files may overlap each other.  So check if the newly
        // added file has expanded the range.  If so, restart search.
        if (begin != nullptr && user_cmp->Compare(file_start, user_begin) < 0) {
          user_begin = file_start;
          inputs->clear();
          i = 0;
        } else if (end != nullptr &&
                   user_cmp->Compare(file_limit, user_end) > 0) {
          user_end = file_limit;
          inputs->clear();
          i = 0;
        }
      }
    }
  }
}